

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O1

iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
* __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *args,
          int *args_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int> begin
  ;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_d8;
  istream_type *local_98;
  int local_90;
  undefined1 local_8c;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  *local_88;
  int local_80;
  undefined1 local_7c;
  difference_type local_78;
  element_type *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_68;
  buffer_value_type *local_60;
  buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
  local_58;
  
  make_buffered_chunk_iterator<boost::iterator_range<std::istream_iterator<int,char,std::char_traits<char>,long>>,int>
            (&local_58,(burst *)args,
             (iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_> *)
             (ulong)(uint)*args_1,(int)args_1);
  local_d8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_d8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_98 = local_58.m_current._M_stream;
  local_90 = local_58.m_current._M_value;
  local_8c = local_58.m_current._M_ok;
  local_88 = (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)local_58.m_end._M_stream;
  local_80 = local_58.m_end._M_value;
  local_7c = local_58.m_end._M_ok;
  local_78 = local_58.m_chunk_size;
  local_70 = local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_68 = local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_60 = local_58.m_chunk_end;
  local_d8.m_current._M_stream = local_58.m_end._M_stream;
  local_d8.m_current._M_value = local_58.m_end._M_value;
  local_d8.m_current._M_ok = local_58.m_end._M_ok;
  local_d8.m_end._M_stream = local_58.m_end._M_stream;
  local_d8.m_end._M_value = local_58.m_end._M_value;
  local_d8.m_end._M_ok = local_58.m_end._M_ok;
  local_d8.m_chunk_size = local_58.m_chunk_size;
  local_d8.m_chunk_end = local_d8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  boost::
  make_iterator_range<burst::buffered_chunk_iterator<std::istream_iterator<int,char,std::char_traits<char>,long>,int>>
            (__return_storage_ptr__,(boost *)&local_98,&local_d8,
             (buffered_chunk_iterator<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_int>
              *)local_58.m_end._M_stream);
  if (local_d8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (p_Stack_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_68);
  }
  if (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.m_chunk.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }